

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

int NewSessionCallback(SSL *ssl,SSL_SESSION *session)

{
  long lVar1;
  long lVar2;
  int iVar3;
  SSL_SESSION *pSVar4;
  TestState *pTVar5;
  void *pvVar6;
  EVP_MD *md;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *in_RCX;
  uchar *buf;
  SSL_SESSION *pSVar7;
  SSL *ssl_00;
  HMAC_CTX *in_R8;
  int in_R9D;
  
  pSVar7 = session;
  ssl_00 = (SSL *)ssl;
  iVar3 = SSL_in_init(ssl);
  if ((iVar3 == 0) &&
     (ssl_00 = (SSL *)ssl, pSVar4 = SSL_get_session((SSL *)ssl), pSVar4 != (SSL_SESSION *)0x0)) {
    pTVar5 = GetTestState(ssl);
    pTVar5->got_new_session = true;
    pTVar5 = GetTestState(ssl);
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&pTVar5->new_session,
               session);
    return 1;
  }
  NewSessionCallback();
  if (in_R9D == 0) {
    pTVar5 = GetTestState((SSL *)ssl_00);
    if (pTVar5->ticket_decrypt_done == true) {
      TicketKeyCallback();
      return -1;
    }
    pTVar5 = GetTestState((SSL *)ssl_00);
    pTVar5->ticket_decrypt_done = true;
    lVar1._0_4_ = pSVar7->super_RefCounted<ssl_session_st>;
    lVar1._4_2_ = pSVar7->ssl_version;
    lVar1._6_2_ = pSVar7->group_id;
    lVar2._0_2_ = pSVar7->peer_signature_algorithm;
    lVar2._2_1_ = (pSVar7->secret).storage_[0];
    lVar2._3_1_ = (pSVar7->secret).storage_[1];
    lVar2._4_1_ = (pSVar7->secret).storage_[2];
    lVar2._5_1_ = (pSVar7->secret).storage_[3];
    lVar2._6_1_ = (pSVar7->secret).storage_[4];
    lVar2._7_1_ = (pSVar7->secret).storage_[5];
    if (lVar1 != 0 || lVar2 != 0) {
      return 0;
    }
  }
  else {
    iVar3 = TestConfigExDataIndex();
    pvVar6 = SSL_get_ex_data(ssl_00,iVar3);
    if (*(char *)((long)pvVar6 + 0x514) != '\0') {
      return 0;
    }
    pSVar7->super_RefCounted<ssl_session_st> = 0;
    pSVar7->ssl_version = 0;
    pSVar7->group_id = 0;
    pSVar7->peer_signature_algorithm = 0;
    (pSVar7->secret).storage_[0] = '\0';
    (pSVar7->secret).storage_[1] = '\0';
    (pSVar7->secret).storage_[2] = '\0';
    (pSVar7->secret).storage_[3] = '\0';
    (pSVar7->secret).storage_[4] = '\0';
    (pSVar7->secret).storage_[5] = '\0';
    RAND_bytes(buf,0x10);
  }
  md = EVP_sha256();
  iVar3 = HMAC_Init_ex(in_R8,"",0x10,md,(ENGINE *)0x0);
  if (iVar3 == 0) {
    return -1;
  }
  cipher = EVP_aes_128_cbc();
  iVar3 = EVP_CipherInit_ex(in_RCX,cipher,(ENGINE *)0x0,"",buf,in_R9D);
  if (in_R9D == 0 && iVar3 != 0) {
    iVar3 = TestConfigExDataIndex();
    pvVar6 = SSL_get_ex_data(ssl_00,iVar3);
    return *(byte *)((long)pvVar6 + 0x513) + 1;
  }
  return -(uint)(iVar3 == 0) | 1;
}

Assistant:

static int NewSessionCallback(SSL *ssl, SSL_SESSION *session) {
  // This callback is called as the handshake completes. |SSL_get_session|
  // must continue to work and, historically, |SSL_in_init| returned false at
  // this point.
  if (SSL_in_init(ssl) || SSL_get_session(ssl) == nullptr) {
    fprintf(stderr, "Invalid state for NewSessionCallback.\n");
    abort();
  }

  GetTestState(ssl)->got_new_session = true;
  GetTestState(ssl)->new_session.reset(session);
  return 1;
}